

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationObject.cpp
# Opt level: O2

BOOL __thiscall
Js::ActivationObject::HasOwnPropertyCheckNoRedecl(ActivationObject *this,PropertyId propertyId)

{
  int iVar1;
  DynamicTypeHandler *pDVar2;
  BOOL BVar3;
  char local_29 [8];
  bool noRedecl;
  
  local_29[0] = '\0';
  pDVar2 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  BVar3 = 0;
  iVar1 = (*pDVar2->_vptr_DynamicTypeHandler[0x11])(pDVar2,this,(ulong)(uint)propertyId,local_29,0);
  if (iVar1 != 0) {
    if (local_29[0] == '\x01') {
      JavascriptError::ThrowReferenceError
                ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary
                   ).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5fbe4,(PCWSTR)0x0);
    }
    BVar3 = 1;
  }
  return BVar3;
}

Assistant:

BOOL ActivationObject::HasOwnPropertyCheckNoRedecl(PropertyId propertyId)
    {
        bool noRedecl = false;
        if (!GetTypeHandler()->HasProperty(this, propertyId, &noRedecl))
        {
            return FALSE;
        }
        else if (noRedecl)
        {
            JavascriptError::ThrowReferenceError(GetScriptContext(), ERRRedeclaration);
        }
        return TRUE;
    }